

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::TexLookup::TexLookup(TexLookup *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ExecValueStorage *this_00;
  pointer ppVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deBool dVar5;
  deUint32 dVar6;
  Variable *variable;
  IsSamplerEntry filter;
  int ndx;
  int iVar7;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var8;
  Type val;
  vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> local_c8;
  ValueEntry *local_b0;
  ExecValueStorage *local_a8;
  deRandom *local_a0;
  VariableType local_98;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> local_48;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_00d59910;
  this->m_type = TYPE_LAST;
  this->m_coordExpr = (Expression *)0x0;
  this->m_lodBiasExpr = (Expression *)0x0;
  (this->m_valueType).m_baseType = TYPE_FLOAT;
  (this->m_valueType).m_precision = PRECISION_NONE;
  (this->m_valueType).m_typeName._M_dataplus._M_p = (pointer)&(this->m_valueType).m_typeName.field_2
  ;
  (this->m_valueType).m_typeName._M_string_length = 0;
  (this->m_valueType).m_typeName.field_2._M_local_buf[0] = '\0';
  (this->m_valueType).m_numElements = 4;
  (this->m_valueType).m_elementType = (VariableType *)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_value;
  ValueStorage<64>::ValueStorage(this_00,&this->m_valueType);
  local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (Type *)0x0;
  local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (Type *)0x0;
  local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
  local_a8 = this_00;
  if (state->m_shaderParams->useTexture2D == true) {
    local_98.m_baseType = TYPE_VOID;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    _M_realloc_insert<rsg::TexLookup::Type>(&local_c8,(iterator)0x0,&local_98.m_baseType);
    local_98.m_baseType = TYPE_FLOAT;
    if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType);
    }
    else {
      *local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_LOD;
      local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_98.m_baseType = TYPE_INT;
    if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType);
    }
    else {
      *local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_PROJ;
      local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_98.m_baseType = TYPE_BOOL;
    if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType);
    }
    else {
      *local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_PROJ_LOD;
      local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (state->m_shaderParams->useTextureCube == true) {
    local_98.m_baseType = TYPE_STRUCT;
    if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType);
    }
    else {
      *local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURECUBE;
      local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_98.m_baseType = TYPE_ARRAY;
    if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_c8,
                 (iterator)
                 local_c8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType);
    }
    else {
      *local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURECUBE_LOD;
      local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_98.m_baseType = TYPE_TEXTURE2D;
  de::Random::
  choose<__gnu_cxx::__normal_iterator<rsg::TexLookup::Type*,std::vector<rsg::TexLookup::Type,std::allocator<rsg::TexLookup::Type>>>,rsg::TexLookup::Type*>
            (state->m_random,
             (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
              )local_c8.
               super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
              )local_c8.
               super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_98.m_baseType,1);
  this->m_type = local_98.m_baseType;
  if (local_98.m_baseType < TYPE_TEXTURECUBE) {
    filter.m_type = TYPE_SAMPLER_2D;
    bVar2 = true;
  }
  else {
    if (local_98.m_baseType - TYPE_TEXTURECUBE < 2) {
      filter.m_type = TYPE_SAMPLER_CUBE;
    }
    else {
      filter.m_type = TYPE_LAST;
    }
    bVar2 = false;
  }
  iVar3 = countSamplers(state->m_varManager,TYPE_SAMPLER_2D);
  iVar4 = countSamplers(state->m_varManager,TYPE_SAMPLER_CUBE);
  iVar7 = iVar4;
  if (bVar2) {
    iVar7 = iVar3;
  }
  if ((iVar7 < 1) ||
     ((iVar4 + iVar3 < state->m_shaderParams->maxSamplers &&
      (dVar5 = deRandom_getBool(&state->m_random->m_rnd), dVar5 == 1)))) {
    local_98.m_typeName._M_dataplus._M_p = (pointer)&local_98.m_typeName.field_2;
    local_98.m_precision = PRECISION_NONE;
    local_98.m_typeName._M_string_length = 0;
    local_98.m_typeName.field_2._M_local_buf[0] = '\0';
    local_98.m_numElements = 1;
    local_98.m_elementType = (VariableType *)0x0;
    local_98.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.m_baseType = filter.m_type;
    variable = VariableManager::allocate(state->m_varManager,&local_98);
    VariableType::~VariableType(&local_98);
    VariableManager::setStorage(state->m_varManager,variable,STORAGE_UNIFORM);
  }
  else {
    local_a0 = &state->m_random->m_rnd;
    VariableManager::getBegin<rsg::(anonymous_namespace)::IsSamplerEntry>
              (&local_48,state->m_varManager,filter);
    ppVVar1 = (state->m_varManager->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_b0 = (ValueEntry *)0x0;
    iVar7 = 0;
    _Var8._M_current =
         local_48.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_iter._M_current;
    do {
      if ((iVar7 < 1) || (dVar6 = deRandom_getUint32(local_a0), (int)(dVar6 % (iVar7 + 1U)) < 1)) {
        local_b0 = *_Var8._M_current;
      }
      local_98.m_baseType =
           local_48.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
           .m_filter.m_type;
      do {
        _Var8._M_current = _Var8._M_current + 1;
        if (_Var8._M_current ==
            local_48.
            super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
            .m_end._M_current) break;
        bVar2 = anon_unknown_0::IsSamplerEntry::operator()
                          ((IsSamplerEntry *)&local_98,*_Var8._M_current);
      } while (!bVar2);
      iVar7 = iVar7 + 1;
    } while (_Var8._M_current != ppVVar1);
    variable = local_b0->m_variable;
  }
  this->m_sampler = variable;
  if (local_c8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TexLookup::TexLookup (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_type			(TYPE_LAST)
	, m_coordExpr		(DE_NULL)
	, m_lodBiasExpr		(DE_NULL)
	, m_valueType		(VariableType::TYPE_FLOAT, 4)
	, m_value			(m_valueType)
{
	DE_ASSERT(valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 4));
	DE_UNREF(valueRange); // Texture output value range is constant.

	// Select type.
	vector<Type> typeCandidates;
	if (state.getShaderParameters().useTexture2D)
	{
		typeCandidates.push_back(TYPE_TEXTURE2D);
		typeCandidates.push_back(TYPE_TEXTURE2D_LOD);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ_LOD);
	}

	if (state.getShaderParameters().useTextureCube)
	{
		typeCandidates.push_back(TYPE_TEXTURECUBE);
		typeCandidates.push_back(TYPE_TEXTURECUBE_LOD);
	}

	m_type = state.getRandom().choose<Type>(typeCandidates.begin(), typeCandidates.end());

	// Select or allocate sampler.
	VariableType::Type samplerType = VariableType::TYPE_LAST;
	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		case TYPE_TEXTURE2D_LOD:
		case TYPE_TEXTURE2D_PROJ:
		case TYPE_TEXTURE2D_PROJ_LOD:
			samplerType = VariableType::TYPE_SAMPLER_2D;
			break;

		case TYPE_TEXTURECUBE:
		case TYPE_TEXTURECUBE_LOD:
			samplerType = VariableType::TYPE_SAMPLER_CUBE;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	int		sampler2DCount		= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_2D);
	int		samplerCubeCount	= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_CUBE);
	bool	canAllocSampler		= sampler2DCount + samplerCubeCount < state.getShaderParameters().maxSamplers;
	bool	hasSampler			= samplerType == VariableType::TYPE_SAMPLER_2D ? (sampler2DCount > 0) : (samplerCubeCount > 0);
	bool	allocSampler		= !hasSampler || (canAllocSampler && state.getRandom().getBool());

	if (allocSampler)
	{
		Variable* sampler = state.getVariableManager().allocate(VariableType(samplerType, 1));
		state.getVariableManager().setStorage(sampler, Variable::STORAGE_UNIFORM); // Samplers are always uniforms.
		m_sampler = sampler;
	}
	else
		m_sampler = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin(IsSamplerEntry(samplerType)),
															    state.getVariableManager().getEnd(IsSamplerEntry(samplerType)))->getVariable();
}